

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::Database(Database *this,string *dir,int id)

{
  int in_EDX;
  pthread_rwlock_t *in_RDI;
  Database *in_stack_000000c0;
  string local_88 [8];
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  Database *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_58 [4];
  int in_stack_ffffffffffffffac;
  string local_38 [56];
  
  in_RDI[1].__data.__lock = in_EDX;
  std::__cxx11::string::string((string *)((long)in_RDI + 0x40));
  pthread_rwlock_init(in_RDI,(pthread_rwlockattr_t *)0x0);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::to_string(in_stack_ffffffffffffffac);
  std::operator+(in_stack_ffffffffffffff98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff90);
  std::__cxx11::string::operator=((string *)((long)in_RDI + 0x40),local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  initIndex(in_stack_ffffffffffffff90);
  initSlices(in_stack_000000c0);
  return;
}

Assistant:

Database::Database(const std::string &dir, int id): id(id) {
    pthread_rwlock_init(&rwlock, nullptr);
    file_prefix = dir + "." + std::to_string(id);
//    printf("Database shard %d initing...\n", id);
    initIndex();
    initSlices();
}